

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmTargetTraceDependencies::CheckCustomCommands
          (cmTargetTraceDependencies *this,
          vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *commands)

{
  bool bVar1;
  reference cc;
  __normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
  local_28;
  __normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
  local_20;
  const_iterator cli;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *commands_local;
  cmTargetTraceDependencies *this_local;
  
  cli._M_current = (cmCustomCommand *)commands;
  local_20._M_current =
       (cmCustomCommand *)
       std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::begin(commands);
  while( true ) {
    local_28._M_current =
         (cmCustomCommand *)
         std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::end(cli._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    cc = __gnu_cxx::
         __normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
         ::operator*(&local_20);
    CheckCustomCommand(this,cc);
    __gnu_cxx::
    __normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void cmTargetTraceDependencies::CheckCustomCommands(
  const std::vector<cmCustomCommand>& commands)
{
  for (std::vector<cmCustomCommand>::const_iterator cli = commands.begin();
       cli != commands.end(); ++cli) {
    this->CheckCustomCommand(*cli);
  }
}